

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::CartesianProductGenerator<bool,_bool>::
IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_>::Advance
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this)

{
  bool bVar1;
  
  bVar1 = AtEnd(this);
  if (!bVar1) {
    (**(code **)(*(long *)(this->current_).
                          super__Tuple_impl<0UL,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<bool>_>
                          .super__Tuple_impl<1UL,_testing::internal::ParamIterator<bool>_>.
                          super__Head_base<1UL,_testing::internal::ParamIterator<bool>,_false>.
                          _M_head_impl.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bool>,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>_>
                + 0x18))();
    CartesianProductGenerator<bool,bool>::IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul>>
    ::AdvanceIfEnd<1ul>((IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul>> *)this);
    ComputeCurrentValue(this);
    return;
  }
  __assert_fail("!AtEnd()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/googletest-src/googletest/include/gtest/internal/gtest-param-util.h"
                ,0x361,
                "virtual void testing::internal::CartesianProductGenerator<bool, bool>::IteratorImpl<std::integer_sequence<unsigned long, 0, 1>>::Advance() [T = <bool, bool>, I = std::integer_sequence<unsigned long, 0, 1>]"
               );
}

Assistant:

void Advance() override {
      assert(!AtEnd());
      // Advance the last iterator.
      ++std::get<sizeof...(T) - 1>(current_);
      // if that reaches end, propagate that up.
      AdvanceIfEnd<sizeof...(T) - 1>();
      ComputeCurrentValue();
    }